

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O1

GridHandle<pbrt::NanoVDBBuffer> *
pbrt::readGrid<pbrt::NanoVDBBuffer>
          (GridHandle<pbrt::NanoVDBBuffer> *__return_storage_ptr__,string *filename,string *gridName
          ,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  memory_resource *pmVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar3;
  long lVar4;
  NanoVDBBuffer buf;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  unsigned_long local_48;
  NanoVDBBuffer local_40;
  undefined4 extraout_var_02;
  
  local_40.bytesAllocated = 0;
  local_40.ptr = (uint8_t *)0x0;
  (__return_storage_ptr__->super_GridHandleBase)._vptr_GridHandleBase =
       (_func_int **)&PTR__GridHandle_0315d2b0;
  local_40.alloc.memoryResource = alloc.memoryResource;
  pmVar2 = pstd::pmr::new_delete_resource();
  (__return_storage_ptr__->mBuffer).alloc.memoryResource = pmVar2;
  (__return_storage_ptr__->mBuffer).bytesAllocated = 0;
  (__return_storage_ptr__->mBuffer).ptr = (uint8_t *)0x0;
  nanovdb::io::readGrid<pbrt::NanoVDBBuffer>
            ((GridHandle<pbrt::NanoVDBBuffer> *)local_68,filename,gridName,0,&local_40);
  NanoVDBBuffer::operator=(&__return_storage_ptr__->mBuffer,(NanoVDBBuffer *)(local_68 + 8));
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle((GridHandle<pbrt::NanoVDBBuffer> *)local_68)
  ;
  iVar1 = (*(__return_storage_ptr__->super_GridHandleBase)._vptr_GridHandleBase[2])
                    (__return_storage_ptr__);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*(__return_storage_ptr__->super_GridHandleBase)._vptr_GridHandleBase[4])
                      (__return_storage_ptr__);
    if (*(int *)(CONCAT44(extraout_var_00,iVar1) + 0x248) != 2) {
      iVar1 = (*(__return_storage_ptr__->super_GridHandleBase)._vptr_GridHandleBase[4])
                        (__return_storage_ptr__);
      if (*(int *)(CONCAT44(extraout_var_01,iVar1) + 0x248) != 0) {
        ErrorExit<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  (loc,"%s: \"%s\" isn\'t a FogVolume grid?",filename,gridName);
      }
    }
    if (LOGGING_LogLevel < 1) {
      iVar1 = (*(__return_storage_ptr__->super_GridHandleBase)._vptr_GridHandleBase[4])
                        (__return_storage_ptr__);
      lVar3 = CONCAT44(extraout_var_02,iVar1);
      lVar4 = (ulong)*(uint *)(lVar3 + 0x250) * 0x120;
      local_48 = *(unsigned_long *)(*(long *)(lVar3 + 0x278 + lVar4) + 0x278 + lVar3 + lVar4);
      local_68._8_8_ = (memory_resource *)0x0;
      local_58._M_local_buf[0] = '\0';
      local_68._0_8_ = &local_58;
      detail::
      stringPrintfRecursive<std::__cxx11::string_const&,unsigned_long,std::__cxx11::string_const&>
                ((string *)local_68,"%s: found %d \"%s\" voxels",filename,&local_48,gridName);
      Log(Verbose,
          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/media.cpp"
          ,0x126,(char *)local_68._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._0_8_ != &local_58) {
        operator_delete((void *)local_68._0_8_,
                        CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]) + 1)
        ;
      }
    }
  }
  NanoVDBBuffer::clear(&local_40);
  return __return_storage_ptr__;
}

Assistant:

static nanovdb::GridHandle<Buffer> readGrid(const std::string &filename,
                                            const std::string &gridName,
                                            const FileLoc *loc, Allocator alloc) {
    NanoVDBBuffer buf(alloc);
    nanovdb::GridHandle<Buffer> grid;
    try {
        grid =
            nanovdb::io::readGrid<Buffer>(filename, gridName, 0 /* not verbose */, buf);
    } catch (const std::exception &e) {
        ErrorExit("nanovdb: %s: %s", filename, e.what());
    }

    if (grid) {
        if (!grid.gridMetaData()->isFogVolume() && !grid.gridMetaData()->isUnknown())
            ErrorExit(loc, "%s: \"%s\" isn't a FogVolume grid?", filename, gridName);

        LOG_VERBOSE("%s: found %d \"%s\" voxels", filename,
                    grid.gridMetaData()->activeVoxelCount(), gridName);
    }

    return grid;
}